

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvariantanimation.cpp
# Opt level: O2

void __thiscall QVariantAnimationPrivate::updateInterpolator(QVariantAnimationPrivate *this)

{
  int interpolationType;
  int iVar1;
  code *pcVar2;
  
  interpolationType = ::QVariant::typeId(&(this->currentInterval).start.second);
  iVar1 = ::QVariant::typeId(&(this->currentInterval).end.second);
  if (interpolationType == iVar1) {
    pcVar2 = getInterpolator(interpolationType);
    if (pcVar2 != (Interpolator)0x0) goto LAB_0036d367;
  }
  pcVar2 = defaultInterpolator;
LAB_0036d367:
  this->interpolator = pcVar2;
  return;
}

Assistant:

void QVariantAnimationPrivate::updateInterpolator()
{
    int type = currentInterval.start.second.userType();
    if (type == currentInterval.end.second.userType())
        interpolator = getInterpolator(type);
    else
        interpolator = nullptr;

    //we make sure that the interpolator is always set to something
    if (!interpolator)
        interpolator = &defaultInterpolator;
}